

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::FunctionValidator::create(FunctionValidator *this)

{
  Module *__args_1;
  long in_RSI;
  FunctionValidator *this_local;
  
  this_local = this;
  __args_1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        *)(in_RSI + 0x30));
  std::make_unique<wasm::FunctionValidator,wasm::Module&,wasm::ValidationInfo*>
            ((Module *)&stack0xffffffffffffffe0,(ValidationInfo **)__args_1);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::FunctionValidator,std::default_delete<wasm::FunctionValidator>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<wasm::FunctionValidator,_std::default_delete<wasm::FunctionValidator>_> *)
             &stack0xffffffffffffffe0);
  std::unique_ptr<wasm::FunctionValidator,_std::default_delete<wasm::FunctionValidator>_>::
  ~unique_ptr((unique_ptr<wasm::FunctionValidator,_std::default_delete<wasm::FunctionValidator>_> *)
              &stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionValidator>(*getModule(), &info);
  }